

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

char * get_line(char *buf,int len,FILE *input)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  size_t rlen;
  char *b;
  _Bool partial;
  FILE *input_local;
  int len_local;
  char *buf_local;
  
  bVar1 = false;
  while( true ) {
    while( true ) {
      __s = fgets(buf,len,(FILE *)input);
      if (__s == (char *)0x0) {
        return (char *)0x0;
      }
      sVar2 = strlen(__s);
      if ((sVar2 != 0) && (__s[sVar2 - 1] == '\n')) break;
      bVar1 = true;
    }
    if (!bVar1) break;
    bVar1 = false;
  }
  return __s;
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}